

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::operator()
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *this,
          vector<rc,_std::allocator<rc>_> *reduced_cost,int r_size,int bk_min,int bk_max)

{
  int iVar1;
  pointer prVar2;
  int iVar3;
  size_type sVar4;
  uint uVar5;
  double *pdVar6;
  long lVar7;
  solver_failure *this_00;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  __i;
  ulong uVar17;
  bool bVar18;
  
  if (bk_min < r_size) {
LAB_001066ee:
    operator()();
  }
  else {
    *(int *)(this + 100) = r_size;
    *(int *)(this + 0x68) = bk_min;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
              *)(this + 0x20),4);
    iVar3 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)0x4);
    if ((char)iVar3 == '\0') goto LAB_001066f8;
    sVar4 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x60) = sVar4;
    if (sVar4 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      prVar2 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = *(long *)(this + 0x20);
      lVar8 = 0;
      do {
        *(undefined8 *)(lVar9 + lVar8 * 2) = *(undefined8 *)((long)&prVar2->value + lVar8);
        *(undefined4 *)(lVar9 + 0x18 + lVar8 * 2) = *(undefined4 *)((long)&prVar2->id + lVar8);
        iVar3 = *(int *)((long)&prVar2->f + lVar8);
        *(int *)(lVar9 + 0x14 + lVar8 * 2) = iVar3;
        iVar13 = -iVar3;
        if (0 < iVar3) {
          iVar13 = iVar3;
        }
        *(int *)(lVar9 + 0x10 + lVar8 * 2) = iVar13;
        *(undefined4 *)(lVar9 + 0x1c + lVar8 * 2) = 0;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x40);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar9 = *(long *)(this + 0x20);
      lVar8 = *(long *)(this + 0x28);
      if (lVar9 != lVar8) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar9,lVar8,(int)LZCOUNT(lVar8 - lVar9 >> 5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar9,lVar8);
      }
      lVar9 = *(long *)(this + 0x20);
      lVar8 = *(long *)(this + 0x28);
      if (lVar8 - lVar9 != 0) {
        lVar10 = lVar8 - lVar9 >> 5;
        iVar3 = *(int *)(this + 100);
        iVar13 = *(int *)(this + 0x68);
        piVar16 = (int *)(lVar9 + 0x14);
        do {
          if (*piVar16 < 0) {
            iVar1 = piVar16[-1];
            iVar3 = iVar3 + iVar1;
            *(int *)(this + 100) = iVar3;
            iVar13 = iVar13 + iVar1;
            *(int *)(this + 0x68) = iVar13;
          }
          piVar16 = piVar16 + 8;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      *(undefined8 *)(lVar8 + -0x18) = *(undefined8 *)(lVar8 + -0x20);
      iVar3 = (int)((ulong)(lVar8 - lVar9) >> 5);
      if (1 < iVar3) {
        uVar17 = (ulong)(iVar3 - 2);
        pdVar6 = (double *)(lVar9 + uVar17 * 0x20);
        lVar9 = uVar17 + 1;
        do {
          pdVar6[1] = pdVar6[5] + *pdVar6;
          pdVar6 = pdVar6 + -4;
          lVar8 = lVar9 + -1;
          bVar18 = 0 < lVar9;
          lVar9 = lVar8;
        } while (lVar8 != 0 && bVar18);
      }
      if (*(int *)(this + 0x68) == *(int *)(this + 100)) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *)this);
      }
      lVar9 = *(long *)(this + 0x20);
      lVar8 = *(long *)(this + 0x28);
      uVar17 = lVar8 - lVar9;
      if ((int)(uVar17 >> 5) != 0) {
        uVar5 = *(uint *)(this + 0x60);
        lVar10 = *(long *)this;
        lVar7 = *(long *)(this + 8);
        uVar11 = uVar17 >> 5 & 0xffffffff;
        puVar12 = (uint *)(lVar9 + 0x1c);
        uVar14 = uVar5;
        do {
          if ((int)puVar12[-2] < 1) {
            if ((ulong)(lVar7 - lVar10) <= (ulong)uVar14) goto LAB_001066e9;
            bVar18 = *(char *)(lVar10 + (ulong)uVar14) == '\0';
          }
          else {
            if ((ulong)(lVar7 - lVar10) <= (ulong)uVar5) {
              operator()();
LAB_001066e9:
              operator()();
              goto LAB_001066ee;
            }
            bVar18 = *(char *)(lVar10 + (ulong)uVar5) != '\0';
          }
          *puVar12 = (uint)bVar18;
          uVar14 = uVar14 + 1;
          uVar5 = uVar5 + 1;
          puVar12 = puVar12 + 8;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if (lVar9 != lVar8) {
        std::operator()(lVar9,lVar8,(int)LZCOUNT((long)uVar17 >> 5) * 2 ^ 0x7e);
        if ((long)uVar17 < 0x201) {
          std::operator()(lVar9,lVar8);
        }
        else {
          lVar10 = lVar9 + 0x200;
          std::operator()(lVar9,lVar10);
          for (; lVar10 != lVar8; lVar10 = lVar10 + 0x20) {
            std::operator()(lVar10);
          }
        }
      }
      lVar9 = *(long *)(this + 0x20);
      lVar8 = *(long *)(this + 0x28);
      uVar17 = lVar8 - lVar9;
      lVar10 = lVar9;
      if (0 < (long)uVar17 >> 7) {
        lVar10 = (uVar17 & 0xffffffffffffff80) + lVar9;
        lVar15 = ((long)uVar17 >> 7) + 1;
        lVar7 = lVar9 + 0x40;
        do {
          if (*(int *)(lVar7 + -0x24) == 0) {
            lVar7 = lVar7 + -0x40;
            goto LAB_00106681;
          }
          if (*(int *)(lVar7 + -4) == 0) {
            lVar7 = lVar7 + -0x20;
            goto LAB_00106681;
          }
          if (*(int *)(lVar7 + 0x1c) == 0) goto LAB_00106681;
          if (*(int *)(lVar7 + 0x3c) == 0) {
            lVar7 = lVar7 + 0x20;
            goto LAB_00106681;
          }
          lVar15 = lVar15 + -1;
          lVar7 = lVar7 + 0x80;
        } while (1 < lVar15);
      }
      lVar15 = lVar8 - lVar10 >> 5;
      if (lVar15 != 1) {
        if (lVar15 != 2) {
          lVar7 = lVar8;
          if ((lVar15 != 3) || (lVar7 = lVar10, *(int *)(lVar10 + 0x1c) == 0)) goto LAB_00106681;
          lVar10 = lVar10 + 0x20;
        }
        lVar7 = lVar10;
        if (*(int *)(lVar10 + 0x1c) == 0) goto LAB_00106681;
        lVar10 = lVar10 + 0x20;
      }
      lVar7 = lVar10;
      if (*(int *)(lVar10 + 0x1c) != 0) {
        lVar7 = lVar8;
      }
LAB_00106681:
      if (lVar8 != lVar9) {
        lVar10 = (long)uVar17 >> 5;
        prVar2 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = 0xc;
        do {
          *(undefined8 *)((long)prVar2 + lVar15 + -0xc) =
               *(undefined8 *)(lVar9 + -0x18 + lVar15 * 2);
          *(undefined4 *)((long)prVar2 + lVar15 + -4) = *(undefined4 *)(lVar9 + lVar15 * 2);
          *(undefined4 *)((long)&prVar2->value + lVar15) = *(undefined4 *)(lVar9 + -4 + lVar15 * 2);
          lVar15 = lVar15 + 0x10;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      if (lVar7 == lVar8) {
        uVar5 = -(uint)(*(int *)(lVar9 + 0x1c) == 0) | 4;
      }
      else {
        uVar5 = (int)((ulong)(lVar7 - lVar9) >> 5) - 1;
      }
      return uVar5;
    }
  }
  operator()();
LAB_001066f8:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }